

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
perfetto::protos::gen::UnregisterTraceWriterRequest::SerializeAsArray
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          UnregisterTraceWriterRequest *this)

{
  HeapBuffered<protozero::Message> msg;
  HeapBuffered<protozero::Message> HStack_d8;
  
  protozero::HeapBuffered<protozero::Message>::HeapBuffered(&HStack_d8,0x1000,0x1000);
  Serialize(this,&HStack_d8.msg_.super_Message);
  protozero::Message::Finalize(&HStack_d8.msg_.super_Message);
  protozero::ScatteredHeapBuffer::StitchSlices(__return_storage_ptr__,&HStack_d8.shb_);
  protozero::MessageArena::~MessageArena(&HStack_d8.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&HStack_d8.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&HStack_d8.shb_);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> UnregisterTraceWriterRequest::SerializeAsArray() const {
  ::protozero::HeapBuffered<::protozero::Message> msg;
  Serialize(msg.get());
  return msg.SerializeAsArray();
}